

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterTests.cpp
# Opt level: O0

void addMiniBatchSize<CoreML::Specification::NeuralNetworkClassifier>
               (NeuralNetworkClassifier *nn,OptimizerTypeCase optimizerType,int64_t defaultValue,
               int64_t minValue,int64_t maxValue,
               set<long,_std::less<long>,_std::allocator<long>_> *allowedValues)

{
  bool bVar1;
  NetworkUpdateParameters *this;
  Optimizer *this_00;
  SGDOptimizer *this_01;
  AdamOptimizer *this_02;
  size_type sVar2;
  Int64Range *this_03;
  Int64Set *this_04;
  reference plVar3;
  long *x;
  iterator __end2;
  iterator __begin2;
  set<long,_std::less<long>,_std::allocator<long>_> *__range2;
  Int64Set *int64Set;
  Int64Range *int64Range;
  Int64Parameter *miniBatchSize;
  Optimizer *optimizer;
  NetworkUpdateParameters *updateParameters;
  set<long,_std::less<long>,_std::allocator<long>_> *allowedValues_local;
  int64_t maxValue_local;
  int64_t minValue_local;
  int64_t defaultValue_local;
  OptimizerTypeCase optimizerType_local;
  NeuralNetworkClassifier *nn_local;
  
  this = CoreML::Specification::NeuralNetworkClassifier::mutable_updateparams(nn);
  this_00 = CoreML::Specification::NetworkUpdateParameters::mutable_optimizer(this);
  int64Range = (Int64Range *)0x0;
  if (optimizerType == kSgdOptimizer) {
    this_01 = CoreML::Specification::Optimizer::mutable_sgdoptimizer(this_00);
    int64Range = (Int64Range *)CoreML::Specification::SGDOptimizer::mutable_minibatchsize(this_01);
  }
  else if (optimizerType == kAdamOptimizer) {
    this_02 = CoreML::Specification::Optimizer::mutable_adamoptimizer(this_00);
    int64Range = (Int64Range *)CoreML::Specification::AdamOptimizer::mutable_minibatchsize(this_02);
  }
  CoreML::Specification::Int64Parameter::set_defaultvalue((Int64Parameter *)int64Range,defaultValue)
  ;
  sVar2 = std::set<long,_std::less<long>,_std::allocator<long>_>::size(allowedValues);
  if (sVar2 == 0) {
    this_03 = CoreML::Specification::Int64Parameter::mutable_range((Int64Parameter *)int64Range);
    CoreML::Specification::Int64Range::set_minvalue(this_03,minValue);
    CoreML::Specification::Int64Range::set_maxvalue(this_03,maxValue);
  }
  else {
    this_04 = CoreML::Specification::Int64Parameter::mutable_set((Int64Parameter *)int64Range);
    __end2 = std::set<long,_std::less<long>,_std::allocator<long>_>::begin(allowedValues);
    x = (long *)std::set<long,_std::less<long>,_std::allocator<long>_>::end(allowedValues);
    while (bVar1 = std::operator!=(&__end2,(_Self *)&x), bVar1) {
      plVar3 = std::_Rb_tree_const_iterator<long>::operator*(&__end2);
      CoreML::Specification::Int64Set::add_values(this_04,*plVar3);
      std::_Rb_tree_const_iterator<long>::operator++(&__end2);
    }
  }
  return;
}

Assistant:

void addMiniBatchSize(NeuralNetworkClass *nn, Specification::Optimizer::OptimizerTypeCase optimizerType, int64_t defaultValue, int64_t minValue,  int64_t maxValue, std::set<int64_t> allowedValues) {
    
    auto updateParameters = nn->mutable_updateparams();
    auto optimizer = updateParameters->mutable_optimizer();
    
    Specification::Int64Parameter *miniBatchSize = NULL;
    
    switch (optimizerType) {
        case Specification::Optimizer::kSgdOptimizer:
            miniBatchSize = optimizer->mutable_sgdoptimizer()->mutable_minibatchsize();
            break;
        case Specification::Optimizer::kAdamOptimizer:
            miniBatchSize = optimizer->mutable_adamoptimizer()->mutable_minibatchsize();
            break;
        default:
            break;
    }
    
    miniBatchSize->set_defaultvalue(defaultValue);
    
    if (allowedValues.size() == 0) {
        auto int64Range = miniBatchSize->mutable_range();
        int64Range->set_minvalue(minValue);
        int64Range->set_maxvalue(maxValue);
    }
    else {
        auto int64Set = miniBatchSize->mutable_set();
        for (auto& x : allowedValues) {
            int64Set->add_values(x);
        }
    }
}